

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O1

void slang::ast::getNetRanges
               (Expression *expr,SmallVectorBase<slang::ast::PortSymbol::NetTypeRange> *ranges)

{
  bitwidth_t *pbVar1;
  ExpressionKind EVar2;
  TimingControl *pTVar3;
  _Optional_payload_base<slang::ast::BinaryOperator> _Var4;
  NetType *pNVar5;
  size_type sVar6;
  bool bVar7;
  Symbol *pSVar8;
  long lVar9;
  NetTypeRange local_30;
  
  while( true ) {
    while( true ) {
      pSVar8 = Expression::getSymbolReference(expr,true);
      if ((pSVar8 != (Symbol *)0x0) && (pSVar8->kind == Net)) {
        pNVar5 = (NetType *)pSVar8[5].name._M_str;
        local_30.width =
             Type::getBitWidth((((AssignmentExpression *)expr)->super_Expression).type.ptr);
        sVar6 = ranges->len;
        if ((sVar6 != 0) && (ranges->data_[sVar6 - 1].netType == pNVar5)) {
          pbVar1 = &ranges->data_[sVar6 - 1].width;
          *pbVar1 = *pbVar1 + local_30.width;
          return;
        }
        local_30.netType = pNVar5;
        SmallVectorBase<slang::ast::PortSymbol::NetTypeRange>::
        emplace_back<slang::ast::PortSymbol::NetTypeRange>(ranges,&local_30);
        return;
      }
      EVar2 = (((AssignmentExpression *)expr)->super_Expression).kind;
      if (EVar2 != Assignment) break;
      bVar7 = AssignmentExpression::isLValueArg((AssignmentExpression *)expr);
      if (!bVar7) {
        return;
      }
      expr = ((AssignmentExpression *)expr)->left_;
    }
    if (EVar2 != Conversion) break;
    if (1 < (int)(((AssignmentExpression *)expr)->op).
                 super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
                 super__Optional_payload_base<slang::ast::BinaryOperator>._M_payload._M_value) {
      return;
    }
    expr = (Expression *)((AssignmentExpression *)expr)->timingControl;
  }
  if (EVar2 != Concatenation) {
    return;
  }
  pTVar3 = ((AssignmentExpression *)expr)->timingControl;
  if (pTVar3 == (TimingControl *)0x0) {
    return;
  }
  _Var4 = (((AssignmentExpression *)expr)->op).
          super__Optional_base<slang::ast::BinaryOperator,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::BinaryOperator>;
  lVar9 = 0;
  do {
    getNetRanges(*(Expression **)((long)_Var4 + lVar9),ranges);
    lVar9 = lVar9 + 8;
  } while ((long)pTVar3 << 3 != lVar9);
  return;
}

Assistant:

static void getNetRanges(const Expression& expr,
                         SmallVectorBase<PortSymbol::NetTypeRange>& ranges) {
    if (auto sym = expr.getSymbolReference(); sym && sym->kind == SymbolKind::Net) {
        auto& nt = sym->as<NetSymbol>().netType;
        bitwidth_t width = expr.type->getBitWidth();

        if (!ranges.empty() && ranges.back().netType == &nt)
            ranges.back().width += width;
        else
            ranges.push_back({&nt, width});
    }
    else if (expr.kind == ExpressionKind::Concatenation) {
        for (auto op : expr.as<ConcatenationExpression>().operands())
            getNetRanges(*op, ranges);
    }
    else if (expr.kind == ExpressionKind::Conversion) {
        auto& conv = expr.as<ConversionExpression>();
        if (conv.isImplicit())
            getNetRanges(conv.operand(), ranges);
    }
    else if (expr.kind == ExpressionKind::Assignment) {
        auto& assign = expr.as<AssignmentExpression>();
        if (assign.isLValueArg())
            getNetRanges(assign.left(), ranges);
    }
}